

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

upb_Arena * upb_Arena_Init(void *mem,size_t n,upb_alloc *alloc)

{
  upb_Arena *puVar1;
  ulong uVar2;
  
  if (mem != (void *)0x0) {
    puVar1 = (upb_Arena *)((long)mem + 7U & 0xfffffffffffffff8);
    uVar2 = 0;
    if ((ulong)((long)puVar1 - (long)mem) <= n) {
      uVar2 = n - ((long)puVar1 - (long)mem);
    }
    if ((puVar1 != (upb_Arena *)0x0) && (0x47 < uVar2)) {
      puVar1[2].ptr_dont_copy_me__upb_internal_use_only = (char *)0x3;
      puVar1[2].end_dont_copy_me__upb_internal_use_only = (char *)0x0;
      puVar1[3].ptr_dont_copy_me__upb_internal_use_only =
           (char *)((long)&puVar1[1].ptr_dont_copy_me__upb_internal_use_only + 1);
      puVar1[1].end_dont_copy_me__upb_internal_use_only = (char *)0x0;
      puVar1[3].end_dont_copy_me__upb_internal_use_only = (char *)0x0;
      puVar1[4].ptr_dont_copy_me__upb_internal_use_only = (char *)0x0;
      if (((ulong)alloc & 1) == 0) {
        puVar1[1].ptr_dont_copy_me__upb_internal_use_only = (char *)((ulong)alloc | 1);
        puVar1->ptr_dont_copy_me__upb_internal_use_only =
             (char *)&puVar1[4].end_dont_copy_me__upb_internal_use_only;
        puVar1->end_dont_copy_me__upb_internal_use_only =
             (char *)((long)&puVar1->ptr_dont_copy_me__upb_internal_use_only + uVar2);
        return puVar1;
      }
      __assert_fail("(alloc_uint & 1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                    ,0xac,"uintptr_t _upb_Arena_MakeBlockAlloc(upb_alloc *, _Bool)");
    }
    n = 0;
    if (puVar1 == (upb_Arena *)0x0) {
      n = uVar2;
    }
  }
  puVar1 = _upb_Arena_InitSlow(alloc,n);
  return puVar1;
}

Assistant:

upb_Arena* upb_Arena_Init(void* mem, size_t n, upb_alloc* alloc) {
  UPB_ASSERT(sizeof(void*) * UPB_ARENA_SIZE_HACK >= sizeof(upb_ArenaState));
  upb_ArenaState* a;

  if (mem) {
    /* Align initial pointer up so that we return properly-aligned pointers. */
    void* aligned = (void*)UPB_ALIGN_MALLOC((uintptr_t)mem);
    size_t delta = (uintptr_t)aligned - (uintptr_t)mem;
    n = delta <= n ? n - delta : 0;
    mem = aligned;
  }
  if (UPB_UNLIKELY(n < sizeof(upb_ArenaState) || !mem)) {
    upb_Arena* ret = _upb_Arena_InitSlow(alloc, mem ? 0 : n);
#ifdef UPB_TRACING_ENABLED
    upb_Arena_LogInit(ret, n);
#endif
    return ret;
  }

  a = mem;

  upb_Atomic_Init(&a->body.parent_or_count, _upb_Arena_TaggedFromRefcount(1));
  upb_Atomic_Init(&a->body.next, NULL);
  upb_Atomic_Init(&a->body.previous_or_tail,
                  _upb_Arena_TaggedFromTail(&a->body));
  upb_Atomic_Init(&a->body.space_allocated, 0);
  a->body.blocks = NULL;
  a->body.upb_alloc_cleanup = NULL;
  a->body.block_alloc = _upb_Arena_MakeBlockAlloc(alloc, 1);
  a->head.UPB_PRIVATE(ptr) = (void*)UPB_ALIGN_MALLOC((uintptr_t)(a + 1));
  a->head.UPB_PRIVATE(end) = UPB_PTR_AT(mem, n, char);
  UPB_TSAN_INIT_PUBLISHED(&a->body);
#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogInit(&a->head, n);
#endif
  return &a->head;
}